

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::(anonymous_namespace)::genColorString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  bool bVar1;
  allocator<char> local_70;
  allocator<char> local_6f;
  allocator<char> local_6e;
  allocator<char> local_6d [20];
  allocator<char> local_59;
  undefined1 local_58 [8];
  Vec4 blue;
  Vec4 yellow;
  Vec4 red;
  Vec4 white;
  Vec4 *p_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(red.m_data + 2),1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_58,0.0,0.0,1.0,1.0);
  bVar1 = tcu::Vector<float,_4>::operator==
                    ((Vector<float,_4> *)this,(Vector<float,_4> *)(red.m_data + 2));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(white)",&local_59);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    bVar1 = tcu::Vector<float,_4>::operator==
                      ((Vector<float,_4> *)this,(Vector<float,_4> *)(yellow.m_data + 2));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"(red)",local_6d);
      std::allocator<char>::~allocator(local_6d);
    }
    else {
      bVar1 = tcu::Vector<float,_4>::operator==
                        ((Vector<float,_4> *)this,(Vector<float,_4> *)(blue.m_data + 2));
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"(yellow)",&local_6e);
        std::allocator<char>::~allocator(&local_6e);
      }
      else {
        bVar1 = tcu::Vector<float,_4>::operator==
                          ((Vector<float,_4> *)this,(Vector<float,_4> *)local_58);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"(blue)",&local_6f);
          std::allocator<char>::~allocator(&local_6f);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"",&local_70);
          std::allocator<char>::~allocator(&local_70);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string genColorString(const tcu::Vec4& p)
{
	const tcu::Vec4 white	(1.0f, 1.0f, 1.0f, 1.0f);
	const tcu::Vec4 red		(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue	(0.0f, 0.0f, 1.0f, 1.0f);

	if (p == white)		return "(white)";
	if (p == red)		return "(red)";
	if (p == yellow)	return "(yellow)";
	if (p == blue)		return "(blue)";
	return "";
}